

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

int __thiscall testing::internal::String::Compare(String *this,String *rhs)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  uint in_EAX;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  bool bVar9;
  
  pcVar1 = this->c_str_;
  pcVar2 = rhs->c_str_;
  if (pcVar1 == (char *)0x0) {
    return -(uint)(pcVar2 != (char *)0x0);
  }
  if (pcVar2 == (char *)0x0) {
    return 1;
  }
  uVar3 = this->length_;
  uVar4 = rhs->length_;
  uVar6 = uVar4;
  if (uVar3 < uVar4) {
    uVar6 = uVar3;
  }
  bVar9 = uVar6 == 0;
  if (!bVar9) {
    cVar8 = *pcVar1;
    cVar5 = *pcVar2;
    in_EAX = 0xffffffff;
    if (cVar5 <= cVar8) {
      uVar7 = 1;
      do {
        if (cVar5 < cVar8) {
          in_EAX = 1;
          break;
        }
        bVar9 = uVar6 == uVar7;
        if (bVar9) break;
        cVar8 = pcVar1[uVar7];
        cVar5 = pcVar2[uVar7];
        uVar7 = uVar7 + 1;
      } while (cVar5 <= cVar8);
    }
  }
  if (bVar9) {
    in_EAX = 0xffffffff;
    if (uVar4 <= uVar3) {
      in_EAX = (uint)(uVar4 < uVar3);
    }
  }
  return in_EAX;
}

Assistant:

const char* c_str() const { return c_str_; }